

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O0

void __thiscall TypeChecker::visit(TypeChecker *this,VariableNode *node)

{
  bool bVar1;
  undefined1 uVar2;
  _Storage<std::reference_wrapper<Symbol>,_true> this_00;
  reference_wrapper<Symbol> *this_01;
  undefined1 uVar3;
  long in_RDI;
  optional<std::reference_wrapper<Symbol>_> oVar4;
  FunctionAnalyser analyser_1;
  VariableAnalyser analyser;
  Symbol *symbol;
  string name;
  VariableNode *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  allocator<char> *__a;
  undefined7 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff24;
  string *in_stack_ffffffffffffff28;
  SymbolTable *in_stack_ffffffffffffff30;
  undefined8 local_b8;
  FunctionAnalyser local_b0;
  _Optional_payload_base<TypeName> local_80;
  undefined8 local_78;
  VariableAnalyser local_70;
  _Storage<std::reference_wrapper<Symbol>,_true> local_48;
  undefined1 local_40;
  Symbol *local_38;
  allocator<char> local_30 [48];
  
  __a = local_30;
  VariableNode::getName_abi_cxx11_(in_stack_fffffffffffffec8);
  oVar4 = SymbolTable::lookup(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                              in_stack_ffffffffffffff24);
  this_00 = oVar4.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>._M_payload.
            super__Optional_payload_base<std::reference_wrapper<Symbol>_>._M_payload;
  uVar3 = oVar4.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>._M_payload.
          super__Optional_payload_base<std::reference_wrapper<Symbol>_>._M_engaged;
  local_48 = this_00;
  local_40 = uVar3;
  this_01 = std::optional<std::reference_wrapper<Symbol>_>::value
                      ((optional<std::reference_wrapper<Symbol>_> *)
                       CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  local_38 = std::reference_wrapper<Symbol>::get(this_01);
  VariableAnalyser::VariableAnalyser
            ((VariableAnalyser *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  (*local_38->_vptr_Symbol[2])(local_38,&local_70);
  bVar1 = VariableAnalyser::isSymbolValid(&local_70);
  if (bVar1) {
    local_80 = (_Optional_payload_base<TypeName>)VariableAnalyser::getType(&local_70);
    std::optional<TypeName>::value
              ((optional<TypeName> *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    std::optional<TypeName>::optional<TypeName,_true>
              ((optional<TypeName> *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
               (TypeName *)in_stack_fffffffffffffec8);
    *(undefined8 *)(in_RDI + 8) = local_78;
  }
  else {
    FunctionAnalyser::FunctionAnalyser
              ((FunctionAnalyser *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    (*local_38->_vptr_Symbol[2])(local_38,&local_b0);
    uVar2 = FunctionAnalyser::isSymbolValid(&local_b0);
    if (!(bool)uVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 (char *)CONCAT17(uVar3,in_stack_ffffffffffffff08),__a);
      reportError((string *)analyser._8_8_,(Node *)analyser.super_SymbolVisitor._vptr_SymbolVisitor)
      ;
    }
    std::optional<TypeName>::optional<TypeName,_true>
              ((optional<TypeName> *)CONCAT17(uVar2,in_stack_fffffffffffffed0),
               (TypeName *)in_stack_fffffffffffffec8);
    *(undefined8 *)(in_RDI + 8) = local_b8;
    FunctionAnalyser::~FunctionAnalyser
              ((FunctionAnalyser *)CONCAT17(uVar2,in_stack_fffffffffffffed0));
  }
  VariableAnalyser::~VariableAnalyser((VariableAnalyser *)0x149519);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void TypeChecker::visit(const VariableNode& node)
{
  auto name = node.getName();
  auto& symbol = symbols_.lookup(name).value().get();
  VariableAnalyser analyser{};
  symbol.accept(analyser);
  if(analyser.isSymbolValid())
    type_ = analyser.getType().value();
  else
  {
    FunctionAnalyser analyser{};
    symbol.accept(analyser);
    if(analyser.isSymbolValid())
      type_ = TypeName::Function;
    else
      reportError("Invalid symbol reference!", node);
  }
}